

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor.cpp
# Opt level: O0

size_t write_some(weak_file_descriptor *fdc,void *data,size_t size)

{
  int iVar1;
  int *piVar2;
  size_t written;
  int err;
  ssize_t res;
  int fd;
  size_t size_local;
  void *data_local;
  weak_file_descriptor *fdc_local;
  
  iVar1 = weak_file_descriptor::getfd(fdc);
  if (iVar1 == -1) {
    __assert_fail("fd != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/file_descriptor.cpp"
                  ,0x7b,"size_t write_some(weak_file_descriptor, const void *, std::size_t)");
  }
  fdc_local = (weak_file_descriptor *)send(iVar1,data,size,0x4000);
  if (fdc_local == (weak_file_descriptor *)0xffffffffffffffff) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (((iVar1 != 0xb) && (iVar1 != 0x68)) && (iVar1 != 0x20)) {
      throw_error(iVar1,"write()");
    }
    fdc_local = (weak_file_descriptor *)0x0;
  }
  else {
    if ((long)fdc_local < 0) {
      __assert_fail("res >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/file_descriptor.cpp"
                    ,0x85,"size_t write_some(weak_file_descriptor, const void *, std::size_t)");
    }
    if (size < fdc_local) {
      __assert_fail("written <= size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/file_descriptor.cpp"
                    ,0x87,"size_t write_some(weak_file_descriptor, const void *, std::size_t)");
    }
  }
  return (size_t)fdc_local;
}

Assistant:

size_t write_some(weak_file_descriptor fdc, void const* data, std::size_t size)
{
    int fd = fdc.getfd();

    assert(fd != -1);
    ssize_t res = ::send(fd, data, size, MSG_NOSIGNAL);
    if (res == -1)
    {
        int err = errno;
        if (err == EAGAIN || err == ECONNRESET || err == EPIPE)
            return 0;
        throw_error(err, "write()");
    }

    assert(res >= 0);
    size_t written = static_cast<size_t>(res);
    assert(written <= size);

    return written;
}